

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq_test.c
# Opt level: O0

void test_xreq_identity(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char *n2;
  char *n1;
  uint16_t p2;
  uint16_t p1;
  nng_socket s;
  
  nVar1 = nng_req0_open_raw((nng_socket *)((long)&n1 + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x1a,"%s: expected success, got %s (%d)","nng_req0_open_raw(&s)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_proto_id(n1._4_4_,(uint16_t *)((long)&n1 + 2));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x1b,"%s: expected success, got %s (%d)","nng_socket_proto_id(s, &p1)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_peer_id(n1._4_4_,(uint16_t *)&n1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x1c,"%s: expected success, got %s (%d)","nng_socket_peer_id(s, &p2)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_proto_name(n1._4_4_,&n2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x1d,"%s: expected success, got %s (%d)","nng_socket_proto_name(s, &n1)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_peer_name(n1._4_4_,(char **)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x1e,"%s: expected success, got %s (%d)","nng_socket_peer_name(s, &n2)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close(n1._4_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x1f,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(n1._2_2_ == 0x30),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                 ,0x20,"%s","p1 == REQ0_SELF");
  acutest_check_((uint)((short)n1 == 0x31),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                 ,0x21,"%s","p2 == REQ0_PEER");
  iVar2 = strcmp(n2,"req");
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                 ,0x22,"%s == %s",n2,"req",nVar1);
  iVar2 = strcmp(_result__1,"rep");
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                 ,0x23,"%s == %s",_result__1,"rep");
  return;
}

Assistant:

static void
test_xreq_identity(void)
{
	nng_socket  s;
	uint16_t    p1, p2;
	const char *n1;
	const char *n2;

	NUTS_PASS(nng_req0_open_raw(&s));
	NUTS_PASS(nng_socket_proto_id(s, &p1));
	NUTS_PASS(nng_socket_peer_id(s, &p2));
	NUTS_PASS(nng_socket_proto_name(s, &n1));
	NUTS_PASS(nng_socket_peer_name(s, &n2));
	NUTS_CLOSE(s);
	NUTS_TRUE(p1 == REQ0_SELF);
	NUTS_TRUE(p2 == REQ0_PEER);
	NUTS_MATCH(n1, REQ0_SELF_NAME);
	NUTS_MATCH(n2, REQ0_PEER_NAME);
}